

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module_registry.cpp
# Opt level: O0

int __thiscall sc_core::sc_module_registry::remove(sc_module_registry *this,char *__filename)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  reference ppsVar2;
  int i;
  char *in_stack_00000038;
  char *in_stack_00000040;
  char *in_stack_00000048;
  sc_severity in_stack_00000054;
  vector<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_> *in_stack_ffffffffffffffc0;
  sc_module *psVar3;
  int local_14;
  
  local_14 = 0;
  while ((iVar1 = size((sc_module_registry *)0x2b0752), local_14 < iVar1 &&
         (ppsVar2 = std::vector<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>::
                    operator[](&this->m_module_vec,(long)local_14),
         (sc_module *)__filename != *ppsVar2))) {
    local_14 = local_14 + 1;
  }
  iVar1 = size((sc_module_registry *)0x2b07a9);
  if (local_14 == iVar1) {
    sc_report_handler::report
              (in_stack_00000054,in_stack_00000048,in_stack_00000040,in_stack_00000038,i);
    iVar1 = extraout_EAX;
  }
  else {
    ppsVar2 = std::vector<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>::back
                        (in_stack_ffffffffffffffc0);
    psVar3 = *ppsVar2;
    ppsVar2 = std::vector<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>::operator[]
                        (&this->m_module_vec,(long)local_14);
    *ppsVar2 = psVar3;
    std::vector<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_>::pop_back
              ((vector<sc_core::sc_module_*,_std::allocator<sc_core::sc_module_*>_> *)0x2b0816);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void
sc_module_registry::remove( sc_module& module_ )
{
    int i;
    for( i = 0; i < size(); ++ i ) {
	if( &module_ == m_module_vec[i] ) {
	    break;
	}
    }
    if( i == size() ) {
        SC_REPORT_ERROR( SC_ID_REMOVE_MODULE_, 0 );
        return;
    }

    // remove
    m_module_vec[i] = m_module_vec.back();
    m_module_vec.pop_back();
}